

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
               (uint *b,uint *end,QTextureData *image,int *fx,int *fy,int fdx,int param_7)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int offset;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  IntermediateBuffer intermediate;
  IntermediateBuffer local_4048;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar11 = (uint)*fy >> 8 & 0xff;
  uVar1 = image->height;
  iVar8 = (*fy >> 0x10) % (int)uVar1;
  uVar6 = iVar8 >> 0x1f & uVar1;
  uVar12 = uVar6 + iVar8 + 1;
  if (uVar12 == uVar1) {
    uVar12 = 0;
  }
  puVar4 = image->imageData;
  lVar5 = image->bytesPerLine;
  iVar9 = (int)((ulong)((long)end - (long)b) >> 2);
  offset = (fdx >> 0x1f & iVar9 * fdx) + *fx >> 0x10;
  uVar7 = (ulong)(uint)-fdx;
  if (0 < fdx) {
    uVar7 = (ulong)(uint)fdx;
  }
  uVar13 = (int)((long)(uVar7 * (long)iVar9 + 0xffff) / 0x10000) + 2;
  uVar1 = image->width;
  iVar9 = offset % (int)uVar1;
  iVar9 = (iVar9 >> 0x1f & uVar1) + iVar9;
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
    uVar10 = uVar1;
    if (iVar9 < (int)uVar1) {
      uVar10 = 0;
    }
    uVar2 = *(uint *)(puVar4 + (long)(int)(iVar9 - uVar10) * 4 + (int)(uVar6 + iVar8) * lVar5);
    uVar3 = *(uint *)(puVar4 + (long)(int)(iVar9 - uVar10) * 4 + (int)uVar12 * lVar5);
    local_4048.buffer_rb[uVar7] =
         (uVar3 & 0xff00ff) * uVar11 + (uVar2 & 0xff00ff) * (0x100 - uVar11) >> 8 & 0xff00ff;
    local_4048.buffer_ag[uVar7] =
         (uVar3 >> 8 & 0xff00ff) * uVar11 + (uVar2 >> 8 & 0xff00ff) * (0x100 - uVar11) >> 8 &
         0xff00ff;
    iVar9 = (iVar9 - uVar10) + 1;
  }
  intermediate_adder(b,end,&local_4048,offset,fx,fdx);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void QT_FASTCALL fetchTransformedBilinearARGB32PM_simple_scale_helper(uint *b, uint *end, const QTextureData &image,
                                                                             int &fx, int &fy, int fdx, int /*fdy*/)
{
    int y1 = (fy >> 16);
    int y2;
    fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);
    const uint *s1 = (const uint *)image.scanLine(y1);
    const uint *s2 = (const uint *)image.scanLine(y2);

    const int disty = (fy & 0x0000ffff) >> 8;
    const int idisty = 256 - disty;
    const int length = end - b;

    // The intermediate buffer is generated in the positive direction
    const int adjust = (fdx < 0) ? fdx * length : 0;
    const int offset = (fx + adjust) >> 16;
    int x = offset;

    Q_DECL_UNINITIALIZED IntermediateBuffer intermediate;
    // count is the size used in the intermediate.buffer.
    int count = (qint64(length) * qAbs(fdx) + fixed_scale - 1) / fixed_scale + 2;
    // length is supposed to be <= BufferSize either because data->m11 < 1 or
    // data->m11 < 2, and any larger buffers split
    Q_ASSERT(count <= BufferSize + 2);
    int f = 0;
    int lim = count;
    if (blendType == BlendTransformedBilinearTiled) {
        x %= image.width;
        if (x < 0) x += image.width;
    } else {
        lim = qMin(count, image.x2 - x);
        if (x < image.x1) {
            Q_ASSERT(x < image.x2);
            uint t = s1[image.x1];
            uint b = s2[image.x1];
            quint32 rb = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
            quint32 ag = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
            do {
                intermediate.buffer_rb[f] = rb;
                intermediate.buffer_ag[f] = ag;
                f++;
                x++;
            } while (x < image.x1 && f < lim);
        }
    }

    if (blendType != BlendTransformedBilinearTiled) {
#if defined(__SSE2__)
        const __m128i disty_ = _mm_set1_epi16(disty);
        const __m128i idisty_ = _mm_set1_epi16(idisty);
        const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = _mm_loadu_si128((const __m128i*)((const uint *)(s1)+x));
            __m128i topAG = _mm_srli_epi16(top, 8);
            __m128i topRB = _mm_and_si128(top, colorMask);
            // Multiplies each color component by idisty
            topAG = _mm_mullo_epi16 (topAG, idisty_);
            topRB = _mm_mullo_epi16 (topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = _mm_loadu_si128((const __m128i*)((const uint *)(s2)+x));
            __m128i bottomAG = _mm_srli_epi16(bottom, 8);
            __m128i bottomRB = _mm_and_si128(bottom, colorMask);
            bottomAG = _mm_mullo_epi16 (bottomAG, disty_);
            bottomRB = _mm_mullo_epi16 (bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG =_mm_add_epi16(topAG, bottomAG);
            rAG = _mm_srli_epi16(rAG, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_ag[f]), rAG);
            __m128i rRB =_mm_add_epi16(topRB, bottomRB);
            rRB = _mm_srli_epi16(rRB, 8);
            _mm_storeu_si128((__m128i*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__ARM_NEON__)
        const int16x8_t disty_ = vdupq_n_s16(disty);
        const int16x8_t idisty_ = vdupq_n_s16(idisty);
        const int16x8_t colorMask = vdupq_n_s16(0x00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            int16x8_t top = vld1q_s16((int16_t*)((const uint *)(s1)+x));
            int16x8_t topAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(top), 8));
            int16x8_t topRB = vandq_s16(top, colorMask);
            // Multiplies each color component by idisty
            topAG = vmulq_s16(topAG, idisty_);
            topRB = vmulq_s16(topRB, idisty_);

            // Same for the s2 vector
            int16x8_t bottom = vld1q_s16((int16_t*)((const uint *)(s2)+x));
            int16x8_t bottomAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(bottom), 8));
            int16x8_t bottomRB = vandq_s16(bottom, colorMask);
            bottomAG = vmulq_s16(bottomAG, disty_);
            bottomRB = vmulq_s16(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            int16x8_t rAG = vaddq_s16(topAG, bottomAG);
            rAG = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rAG), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_ag[f]), rAG);
            int16x8_t rRB = vaddq_s16(topRB, bottomRB);
            rRB = vreinterpretq_s16_u16(vshrq_n_u16(vreinterpretq_u16_s16(rRB), 8));
            vst1q_s16((int16_t*)(&intermediate.buffer_rb[f]), rRB);
        }
#elif defined(__loongarch_sx)
        const __m128i disty_ = __lsx_vreplgr2vr_h(disty);
        const __m128i idisty_ = __lsx_vreplgr2vr_h(idisty);
        const __m128i colorMask = __lsx_vreplgr2vr_w(0x00ff00ff);

        lim -= 3;
        for (; f < lim; x += 4, f += 4) {
            // Load 4 pixels from s1, and split the alpha-green and red-blue component
            __m128i top = __lsx_vld((const __m128i*)((const uint *)(s1)+x), 0);
            __m128i topAG = __lsx_vsrli_h(top, 8);
            __m128i topRB = __lsx_vand_v(top, colorMask);
            // Multiplies each color component by idisty
            topAG = __lsx_vmul_h(topAG, idisty_);
            topRB = __lsx_vmul_h(topRB, idisty_);

            // Same for the s2 vector
            __m128i bottom = __lsx_vld((const __m128i*)((const uint *)(s2)+x), 0);
            __m128i bottomAG = __lsx_vsrli_h(bottom, 8);
            __m128i bottomRB = __lsx_vand_v(bottom, colorMask);
            bottomAG = __lsx_vmul_h(bottomAG, disty_);
            bottomRB = __lsx_vmul_h(bottomRB, disty_);

            // Add the values, and shift to only keep 8 significant bits per colors
            __m128i rAG = __lsx_vadd_h(topAG, bottomAG);
            rAG = __lsx_vsrli_h(rAG, 8);
            __lsx_vst(rAG, (__m128i*)(&intermediate.buffer_ag[f]), 0);
            __m128i rRB = __lsx_vadd_h(topRB, bottomRB);
            rRB = __lsx_vsrli_h(rRB, 8);
            __lsx_vst(rRB, (__m128i*)(&intermediate.buffer_rb[f]), 0);
        }
#endif
    }
    for (; f < count; f++) { // Same as above but without simd
        if (blendType == BlendTransformedBilinearTiled) {
            if (x >= image.width) x -= image.width;
        } else {
            x = qMin(x, image.x2 - 1);
        }

        uint t = s1[x];
        uint b = s2[x];

        intermediate.buffer_rb[f] = (((t & 0xff00ff) * idisty + (b & 0xff00ff) * disty) >> 8) & 0xff00ff;
        intermediate.buffer_ag[f] = ((((t>>8) & 0xff00ff) * idisty + ((b>>8) & 0xff00ff) * disty) >> 8) & 0xff00ff;
        x++;
    }

    // Now interpolate the values from the intermediate.buffer to get the final result.
    intermediate_adder(b, end, intermediate, offset, fx, fdx);
}